

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O2

char * sfnt_get_ps_name(TT_Face face)

{
  char cVar1;
  FT_UInt FVar2;
  FT_Memory pFVar3;
  TT_NameRec *pTVar4;
  FT_Stream pFVar5;
  void *pvVar6;
  FT_Memory memory;
  FT_Bool FVar7;
  byte bVar8;
  FT_UInt32 FVar9;
  FT_UInt32 FVar10;
  FT_UInt32 FVar11;
  char *pcVar12;
  size_t sVar13;
  FT_Var_Named_Style *pFVar14;
  char *pcVar15;
  FT_ULong FVar16;
  uint uVar17;
  long lVar18;
  uint *puVar19;
  int *piVar20;
  uint uVar21;
  FT_UInt32 FVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  FT_Var_Axis *pFVar28;
  FT_Byte *data;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  byte *pbVar32;
  char *pcVar33;
  byte *pbVar34;
  bool bVar35;
  FT_Int apple_1;
  FT_Int win_1;
  FT_Int apple;
  FT_UInt num_coords;
  FT_MM_Var *mm_var;
  FT_Error error;
  FT_Int win;
  int iStack_44;
  int local_40;
  uint local_3c;
  char *local_38;
  
  if (face->postscript_name != (char *)0x0) {
    return face->postscript_name;
  }
  if ((face->blend == (GX_Blend)0x0) ||
     ((((face->root).face_index & 0x7fff0000) == 0 && (((face->root).face_flags & 0x8000) == 0)))) {
    FVar7 = sfnt_get_name_id(face,6,&win,&apple);
    if (FVar7 == '\0') {
      return (char *)0x0;
    }
    pFVar3 = (face->root).memory;
    pTVar4 = (face->name_table).names;
    pFVar5 = (face->name_table).stream;
    if ((long)win == -1) {
      pcVar12 = get_apple_string(pFVar3,pFVar5,pTVar4 + apple,sfnt_is_postscript,'\x01');
    }
    else {
      pcVar12 = get_win_string(pFVar3,pFVar5,pTVar4 + win,sfnt_is_postscript,'\x01');
    }
    goto LAB_0015f096;
  }
  pFVar3 = (face->root).memory;
  pvVar6 = face->mm;
  if (face->var_postscript_prefix == (char *)0x0) {
    FVar7 = sfnt_get_name_id(face,0x19,&win_1,&apple_1);
    if (((FVar7 != '\0') || (FVar7 = sfnt_get_name_id(face,0x10,&win_1,&apple_1), FVar7 != '\0')) ||
       (FVar7 = sfnt_get_name_id(face,1,&win_1,&apple_1), FVar7 != '\0')) {
      memory = (face->root).memory;
      pTVar4 = (face->name_table).names;
      pFVar5 = (face->name_table).stream;
      if ((long)win_1 == -1) {
        pcVar12 = get_apple_string(memory,pFVar5,pTVar4 + apple_1,sfnt_is_alphanumeric,'\0');
      }
      else {
        pcVar12 = get_win_string(memory,pFVar5,pTVar4 + win_1,sfnt_is_alphanumeric,'\0');
      }
      sVar13 = strlen(pcVar12);
      uVar24 = (uint)sVar13;
      if (0x5b < uVar24) {
        pcVar12[0x5b] = '\0';
        uVar24 = 0x5b;
      }
      face->var_postscript_prefix = pcVar12;
      face->var_postscript_prefix_len = uVar24;
      goto LAB_0015e974;
    }
LAB_0015eb0d:
    pcVar12 = (char *)0x0;
  }
  else {
LAB_0015e974:
    (**(code **)((long)pvVar6 + 0x40))(face,&num_coords,&apple,0,&mm_var);
    uVar30 = (face->root).face_index & 0x7fff0000;
    if ((uVar30 == 0) || (((face->root).face_flags & 0x8000) != 0)) {
LAB_0015eadb:
      pFVar28 = mm_var->axis;
      pcVar12 = (char *)ft_mem_alloc(pFVar3,(ulong)(face->var_postscript_prefix_len +
                                                    num_coords * 0x11 + 1),&error);
      uVar24 = 0;
      if (error != 0) goto LAB_0015eb0d;
      strcpy(pcVar12,face->var_postscript_prefix);
      pbVar32 = (byte *)(pcVar12 + face->var_postscript_prefix_len);
      for (; uVar24 < num_coords; uVar24 = uVar24 + 1) {
        pbVar34 = pbVar32;
        if (*(long *)_apple != pFVar28->def) {
          pbVar34 = pbVar32 + 1;
          *pbVar32 = 0x5f;
          uVar25 = *_apple;
          if (uVar25 == 0) {
            pbVar32[1] = 0x30;
            pbVar34 = pbVar32 + 2;
          }
          else {
            if ((int)uVar25 < 0) {
              pbVar32[1] = 0x2d;
              pbVar34 = pbVar32 + 2;
              uVar25 = -uVar25;
            }
            pbVar32 = (byte *)&win;
            for (uVar23 = uVar25 >> 0x10; uVar23 != 0; uVar23 = uVar23 / 10) {
              *pbVar32 = (byte)((ulong)uVar23 % 10) | 0x30;
              pbVar32 = pbVar32 + 1;
            }
            for (lVar31 = 0; &win < pbVar32 + lVar31; lVar31 = lVar31 + -1) {
              *pbVar34 = pbVar32[lVar31 + -1];
              pbVar34 = pbVar34 + 1;
            }
            if ((uVar25 & 0xffff) != 0) {
              *pbVar34 = 0x2e;
              uVar25 = (uVar25 & 0xffff) * 10 + 5;
              bVar8 = 0x2e;
              for (lVar31 = 0; (int)lVar31 != 5; lVar31 = lVar31 + 1) {
                bVar8 = (char)(uVar25 >> 0x10) + 0x30;
                pbVar34[lVar31 + 1] = bVar8;
                if ((uVar25 & 0xffff) == 0) {
                  pbVar34 = pbVar34 + lVar31 + 1;
                  if (lVar31 != 4) goto LAB_0015ed70;
                  if (bVar8 == 0x31) goto LAB_0015ed5d;
                  goto LAB_0015ed64;
                }
                uVar25 = (uVar25 & 0xffff) * 10;
              }
              pbVar34 = pbVar34 + lVar31;
              if ((lVar31 == 5) && (uVar25 < 0x542e0)) {
                if (bVar8 == 0x31) {
LAB_0015ed5d:
                  *pbVar34 = 0x30;
LAB_0015ed68:
                  bVar8 = 0x30;
                }
                else if (uVar25 == 0x2a120) {
                  if ((bVar8 & 1) != 0) {
LAB_0015ed6c:
                    bVar8 = bVar8 - 1;
                    *pbVar34 = bVar8;
                  }
                }
                else if (uVar25 < 0x2a120) {
LAB_0015ed64:
                  if (bVar8 == 0x30) goto LAB_0015ed68;
                  goto LAB_0015ed6c;
                }
              }
LAB_0015ed70:
              pbVar34 = pbVar34 + 1;
              while (bVar8 == 0x30) {
                pbVar34[-1] = 0;
                pbVar32 = pbVar34 + -2;
                pbVar34 = pbVar34 + -1;
                bVar8 = *pbVar32;
              }
            }
          }
          FVar16 = pFVar28->tag;
          if (((uint)(FVar16 >> 0x18) & 0xff) != 0x20) {
            bVar8 = (byte)(FVar16 >> 0x18);
            iVar26 = (int)(char)bVar8;
            if (iVar26 - 0x61U < 0x1a || (iVar26 - 0x41U < 0x1a || iVar26 - 0x30U < 10)) {
              *pbVar34 = bVar8;
              pbVar34 = pbVar34 + 1;
              FVar16 = pFVar28->tag;
            }
          }
          bVar8 = (byte)(FVar16 >> 0x10);
          if ((bVar8 != 0x20) &&
             (iVar26 = (int)(char)bVar8,
             iVar26 - 0x61U < 0x1a || (iVar26 - 0x41U < 0x1a || iVar26 - 0x30U < 10))) {
            *pbVar34 = bVar8;
            pbVar34 = pbVar34 + 1;
            FVar16 = pFVar28->tag;
          }
          bVar8 = (byte)(FVar16 >> 8);
          if ((bVar8 != 0x20) &&
             (iVar26 = (int)(char)bVar8,
             iVar26 - 0x61U < 0x1a || (iVar26 - 0x41U < 0x1a || iVar26 - 0x30U < 10))) {
            *pbVar34 = bVar8;
            pbVar34 = pbVar34 + 1;
            FVar16 = pFVar28->tag;
          }
          bVar8 = (byte)FVar16;
          if ((bVar8 != 0x20) &&
             (iVar26 = (int)(char)bVar8,
             iVar26 - 0x61U < 0x1a || (iVar26 - 0x41U < 0x1a || iVar26 - 0x30U < 10))) {
            *pbVar34 = bVar8;
            pbVar34 = pbVar34 + 1;
          }
        }
        _apple = _apple + 2;
        pFVar28 = pFVar28 + 1;
        pbVar32 = pbVar34;
      }
    }
    else {
      pvVar6 = face->sfnt;
      lVar31 = (uVar30 >> 0x10) - 1;
      pFVar14 = mm_var->namedstyle;
      FVar2 = pFVar14[lVar31].psid;
      _win = (char *)0x0;
      if (FVar2 == 6 || FVar2 - 0x100 < 0x7f00) {
        (**(code **)((long)pvVar6 + 0xe8))(face,(short)FVar2,&win);
        pcVar12 = _win;
        if (_win == (char *)0x0) {
          pFVar14 = mm_var->namedstyle;
          goto LAB_0015ea21;
        }
        sVar13 = strlen(_win);
        pbVar32 = (byte *)(pcVar12 + sVar13 + 1);
      }
      else {
LAB_0015ea21:
        (**(code **)((long)pvVar6 + 0xe8))(face,(short)pFVar14[lVar31].strid,&local_38);
        if (local_38 == (char *)0x0) goto LAB_0015eadb;
        FVar2 = face->var_postscript_prefix_len;
        sVar13 = strlen(local_38);
        pcVar12 = (char *)ft_mem_alloc(pFVar3,sVar13 + (FVar2 + 1) + 1,&error);
        if (error != 0) goto LAB_0015eb0d;
        strcpy(pcVar12,face->var_postscript_prefix);
        pcVar33 = pcVar12 + (ulong)face->var_postscript_prefix_len + 1;
        pcVar12[face->var_postscript_prefix_len] = '-';
        pcVar15 = local_38;
        while( true ) {
          cVar1 = *pcVar15;
          iVar26 = (int)cVar1;
          if (cVar1 == '\0') break;
          if (iVar26 - 0x61U < 0x1a || (iVar26 - 0x41U < 0x1a || iVar26 - 0x30U < 10)) {
            *pcVar33 = cVar1;
            pcVar33 = pcVar33 + 1;
          }
          pcVar15 = pcVar15 + 1;
        }
        *pcVar33 = '\0';
        pbVar32 = (byte *)(pcVar33 + 1);
        ft_mem_free(pFVar3,local_38);
      }
    }
    uVar30 = (long)pbVar32 - (long)pcVar12;
    if (0x7f < (long)uVar30) {
      uVar29 = (uint)uVar30;
      iVar26 = (int)((long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar30 & 0xffffffff) / 0x10
                    );
      lVar18 = (long)iVar26;
      lVar31 = (long)(iVar26 << 4);
      piVar20 = (int *)(pcVar12 + lVar31 + lVar18 * -0x10 + 0xc);
      uVar27 = 0x75bcd15;
      uVar23 = 0x75bcd15;
      uVar24 = 0x75bcd15;
      uVar25 = 0x75bcd15;
      while (bVar35 = lVar18 != 0, lVar18 = lVar18 + -1, bVar35) {
        uVar25 = ((uint)(piVar20[-3] * 0x239b961b) >> 0x11 | piVar20[-3] * -0x34f28000) *
                 -0x54f16877 ^ uVar25;
        iVar26 = (uVar25 << 0x13 | uVar25 >> 0xd) + uVar24;
        uVar24 = ((uint)(piVar20[-2] * -0x54f16877) >> 0x10 | piVar20[-2] * -0x68770000) *
                 0x38b34ae5 ^ uVar24;
        uVar25 = iVar26 * 5 + 0x561ccd1b;
        uVar24 = ((uVar24 << 0x11 | uVar24 >> 0xf) + uVar23) * 5 + 0xbcaa747;
        uVar23 = ((uint)(piVar20[-1] * 0x38b34ae5) >> 0xf | piVar20[-1] * -0x6a360000) * -0x5e1c746d
                 ^ uVar23;
        uVar21 = ((uint)(*piVar20 * -0x5e1c746d) >> 0xe | *piVar20 * 0x2e4c0000) * 0x239b961b ^
                 uVar27;
        uVar23 = ((uVar23 << 0xf | uVar23 >> 0x11) + uVar27) * 5 + 0x96cd1c35;
        uVar27 = ((uVar21 << 0xd | uVar21 >> 0x13) + iVar26 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
        piVar20 = piVar20 + 4;
      }
      uVar17 = 0;
      uVar21 = 0;
      switch(uVar29 & 0xf) {
      case 0xf:
        uVar21 = (uint)(byte)pcVar12[lVar31 + 0xe] << 0x10;
      case 0xe:
        uVar21 = uVar21 | (uint)(byte)pcVar12[lVar31 + 0xd] << 8;
      case 0xd:
        uVar27 = uVar27 ^ (((byte)pcVar12[lVar31 + 0xc] ^ uVar21) * -0x5e1c746d >> 0xe |
                          ((byte)pcVar12[lVar31 + 0xc] ^ uVar21) * 0x2e4c0000) * 0x239b961b;
      case 0xc:
        uVar21 = (uint)(byte)pcVar12[lVar31 + 0xb] << 0x18;
      case 0xb:
        uVar21 = uVar21 | (uint)(byte)pcVar12[lVar31 + 10] << 0x10;
      case 10:
        uVar21 = uVar21 ^ (uint)(byte)pcVar12[lVar31 + 9] << 8;
      case 9:
        uVar23 = uVar23 ^ (((byte)pcVar12[lVar31 + 8] ^ uVar21) * 0x38b34ae5 >> 0xf |
                          ((byte)pcVar12[lVar31 + 8] ^ uVar21) * -0x6a360000) * -0x5e1c746d;
      case 8:
        uVar21 = (uint)(byte)pcVar12[lVar31 + 7] << 0x18;
      case 7:
        uVar21 = uVar21 | (uint)(byte)pcVar12[lVar31 + 6] << 0x10;
      case 6:
        uVar21 = uVar21 ^ (uint)(byte)pcVar12[lVar31 + 5] << 8;
      case 5:
        uVar24 = uVar24 ^ (((byte)pcVar12[lVar31 + 4] ^ uVar21) * -0x54f16877 >> 0x10 |
                          ((byte)pcVar12[lVar31 + 4] ^ uVar21) * -0x68770000) * 0x38b34ae5;
      case 4:
        uVar21 = (uint)(byte)pcVar12[lVar31 + 3] << 0x18;
      case 3:
        uVar17 = uVar21 | (uint)(byte)pcVar12[lVar31 + 2] << 0x10;
      case 2:
        uVar17 = uVar17 ^ (uint)(byte)pcVar12[lVar31 + 1] << 8;
      case 1:
        uVar25 = uVar25 ^ (((byte)pcVar12[lVar31] ^ uVar17) * 0x239b961b >> 0x11 |
                          ((byte)pcVar12[lVar31] ^ uVar17) * -0x34f28000) * -0x54f16877;
      case 0:
        FVar22 = (uVar25 ^ uVar29) + (uVar24 ^ uVar29) + (uVar23 ^ uVar29) + (uVar27 ^ uVar29);
        FVar9 = fmix32(FVar22);
        FVar10 = fmix32((uVar24 ^ uVar29) + FVar22);
        FVar11 = fmix32((uVar23 ^ uVar29) + FVar22);
        FVar22 = fmix32((uVar27 ^ uVar29) + FVar22);
        iVar26 = FVar9 + FVar10 + FVar11 + FVar22;
        puVar19 = &local_3c;
        _win = (char *)CONCAT44(FVar10 + iVar26,iVar26);
        local_40 = FVar11 + iVar26;
        local_3c = FVar22 + iVar26;
        pcVar15 = pcVar12 + face->var_postscript_prefix_len;
        pcVar33 = pcVar15 + 0x20;
        *pcVar15 = '-';
        pcVar15[0x21] = '.';
        pcVar15[0x22] = '.';
        pcVar15[0x23] = '.';
        pcVar15[0x24] = '\0';
        for (iVar26 = 0; iVar26 != 4; iVar26 = iVar26 + 1) {
          uVar24 = *puVar19;
          for (lVar31 = 0; (int)lVar31 != -8; lVar31 = lVar31 + -1) {
            pcVar33[lVar31] = "0123456789ABCDEF"[uVar24 & 0xf];
            uVar24 = uVar24 >> 4;
          }
          puVar19 = puVar19 + -1;
          pcVar33 = pcVar33 + lVar31;
        }
      }
    }
  }
LAB_0015f096:
  face->postscript_name = pcVar12;
  return pcVar12;
}

Assistant:

static const char*
  sfnt_get_ps_name( TT_Face  face )
  {
    FT_Int       found, win, apple;
    const char*  result = NULL;


    if ( face->postscript_name )
      return face->postscript_name;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( face->blend                                 &&
         ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) ||
           FT_IS_VARIATION( FT_FACE( face ) )      ) )
    {
      face->postscript_name = sfnt_get_var_ps_name( face );
      return face->postscript_name;
    }
#endif

    /* scan the name table to see whether we have a Postscript name here, */
    /* either in Macintosh or Windows platform encodings                  */
    found = sfnt_get_name_id( face, TT_NAME_ID_PS_NAME, &win, &apple );
    if ( !found )
      return NULL;

    /* prefer Windows entries over Apple */
    if ( win != -1 )
      result = get_win_string( face->root.memory,
                               face->name_table.stream,
                               face->name_table.names + win,
                               sfnt_is_postscript,
                               1 );
    else
      result = get_apple_string( face->root.memory,
                                 face->name_table.stream,
                                 face->name_table.names + apple,
                                 sfnt_is_postscript,
                                 1 );

    face->postscript_name = result;

    return result;
  }